

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.h
# Opt level: O2

void __thiscall VmInstruction::~VmInstruction(VmInstruction *this)

{
  ~VmInstruction(this);
  operator_delete(this,0x138);
  return;
}

Assistant:

VmInstruction(Allocator *allocator, VmType type, SynBase *source, VmInstructionType cmd, unsigned uniqueId): VmValue(myTypeID, allocator, type, source), cmd(cmd), uniqueId(uniqueId), arguments(allocator), regVmRegisters(allocator)
	{
		parent = NULL;

		prevSibling = NULL;
		nextSibling = NULL;

		regVmAllocated = false;

		regVmCompletedUsers = 0;

		regVmSearchMarker = 0;

		color = 0;
		marker = 0;

		idom = NULL;
		intersectingIdom = NULL;
	}